

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O2

void __thiscall File_Failures_Test::~File_Failures_Test(File_Failures_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(File, Failures) {
    std::vector<float> floats = ReadFloatFile("NO_SUCH_FILE_64622");
    EXPECT_EQ(0, floats.size());

    std::string fn = inTestDir("malformed.txt");
    EXPECT_TRUE(WriteFile(fn, R"(1
2 3 4
l5l
6


)"));
    floats = ReadFloatFile(fn);
    EXPECT_TRUE(floats.empty());

    remove(fn.c_str());
}